

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t process_head_service(archive_read *a,rar5 *rar,archive_entry *entry,size_t block_flags)

{
  undefined1 *puVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  
  wVar2 = process_head_file(a,rar,entry,block_flags);
  if (wVar2 == L'\0') {
    puVar1 = &(rar->file).field_0x20;
    *puVar1 = *puVar1 | 2;
    wVar3 = rar5_read_data_skip(a);
    wVar2 = L'\xfffffff6';
    if (wVar3 != L'\0') {
      wVar2 = wVar3;
    }
  }
  return wVar2;
}

Assistant:

static int process_head_service(struct archive_read* a, struct rar5* rar,
    struct archive_entry* entry, size_t block_flags)
{
	/* Process this SERVICE block the same way as FILE blocks. */
	int ret = process_head_file(a, rar, entry, block_flags);
	if(ret != ARCHIVE_OK)
		return ret;

	rar->file.service = 1;

	/* But skip the data part automatically. It's no use for the user
	 * anyway.  It contains only service data, not even needed to
	 * properly unpack the file. */
	ret = rar5_read_data_skip(a);
	if(ret != ARCHIVE_OK)
		return ret;

	/* After skipping, try parsing another block automatically. */
	return ARCHIVE_RETRY;
}